

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_get_rx_pwr(tcv_t *tcv,uint16_t *pwr)

{
  _Bool _Var1;
  int local_24;
  int ret;
  uint16_t *pwr_local;
  tcv_t *tcv_local;
  
  local_24 = -0xc;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if ((_Var1) && (pwr != (uint16_t *)0x0)) {
    if (tcv->fun->get_rx_pwr != (_func_int_tcv_t_ptr_uint16_t_ptr *)0x0) {
      local_24 = (*tcv->fun->get_rx_pwr)(tcv,pwr);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_24;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_get_rx_pwr(tcv_t* tcv, uint16_t* pwr)
{
	/* Not all have Digital diagnostics */
	int ret = TCV_ERR_FEATURE_NOT_AVAILABLE;

	if (!tcv_check_and_lock_ok(tcv) || !pwr)
		return TCV_ERR_INVALID_ARG;

	if (tcv->fun->get_rx_pwr)
		ret = tcv->fun->get_rx_pwr(tcv, pwr);

	tcv_unlock(tcv);
	return ret;
}